

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytes.c
# Opt level: O1

adt_bytes_t * adt_bytes_new(uint8_t *dataBuf,uint32_t dataLen)

{
  adt_bytes_t *__ptr;
  uint8_t *__dest;
  
  __ptr = (adt_bytes_t *)malloc(0x10);
  if (__ptr != (adt_bytes_t *)0x0) {
    __ptr->dataLen = dataLen;
    __ptr->dataBuf = (uint8_t *)0x0;
    if (dataLen == 0 || dataBuf == (uint8_t *)0x0) {
      return __ptr;
    }
    __dest = (uint8_t *)malloc((ulong)dataLen);
    __ptr->dataBuf = __dest;
    if (__dest != (uint8_t *)0x0) {
      memcpy(__dest,dataBuf,(ulong)dataLen);
      return __ptr;
    }
    free(__ptr);
  }
  return (adt_bytes_t *)0x0;
}

Assistant:

adt_bytes_t *adt_bytes_new(const uint8_t *dataBuf, uint32_t dataLen)
{
   adt_bytes_t *self = (adt_bytes_t*) malloc(sizeof(adt_bytes_t));
   if (self != 0)
   {
      adt_error_t result = adt_bytes_create(self, dataBuf, dataLen);
      if (result != ADT_NO_ERROR)
      {
         free(self);
         self = (adt_bytes_t*) 0;
      }
   }
   return self;
}